

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O3

size_t final_depth(size_t eliminations)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  do {
    sVar2 = sVar1;
    if (eliminations - 1 >> ((byte)sVar2 & 0x3f) == 0) {
      return sVar2;
    }
    sVar1 = sVar2 + 1;
  } while (sVar2 + 1 != 0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"too many eliminations",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return sVar2;
}

Assistant:

size_t final_depth(size_t eliminations)
{
  eliminations--;
  for (size_t i = 0; i < 32; i++)
    if (eliminations >> i == 0)
      return i;
  cerr << "too many eliminations" << endl;
  return 31;
}